

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O1

RK_S32 check_cap(vdpp2_params *params)

{
  uint uVar1;
  bool bVar2;
  char *fmt;
  uint uVar3;
  int iVar4;
  
  if (params == (vdpp2_params *)0x0) {
    if (((byte)vdpp2_debug & 4) == 0) {
      return 0;
    }
    _mpp_log_l(4,"vdpp2","found null pointer params\n",(char *)0x0);
    return 0;
  }
  if ((params->src_height_vir < params->src_height) || (params->src_width_vir < params->src_width))
  {
    if (((byte)vdpp2_debug & 4) == 0) {
      return 0;
    }
    _mpp_log_l(4,"vdpp2","invalid src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",(char *)0x0,
               (ulong)params->src_width,(ulong)params->src_height,(ulong)params->src_width_vir,
               (ulong)params->src_height_vir);
    return 0;
  }
  iVar4 = 0;
  if (((params->src_fmt != 0) && (iVar4 = 0, params->src_fmt != 5)) &&
     (iVar4 = 1, ((byte)vdpp2_debug & 4) != 0)) {
    _mpp_log_l(4,"vdpp2","vep only support nv12 or nv21\n",(char *)0x0);
  }
  uVar3 = params->src_height_vir;
  if ((((0x800 < uVar3) || (0x780 < params->src_width_vir)) ||
      ((params->src_height < 0x80 || ((params->src_width_vir < 0x80 || (uVar3 < 0x80)))))) ||
     (params->src_width < 0x80)) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",
                 (char *)0x0,(ulong)params->src_width,(ulong)params->src_height,
                 (ulong)params->src_width_vir,(ulong)uVar3);
    }
    iVar4 = iVar4 + 1;
  }
  uVar3 = params->dst_height_vir;
  if ((((((0x800 < uVar3) || (uVar1 = params->dst_width_vir, 0x780 < uVar1)) ||
        (params->dst_height < 0x80)) ||
       ((uVar1 < params->dst_width || (uVar3 < params->dst_height)))) || (uVar1 < 0x80)) ||
     ((uVar3 < 0x80 || (params->dst_width < 0x80)))) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported dst img_w %d img_h %d img_w_vir %d img_h_vir %d\n",
                 (char *)0x0,(ulong)params->dst_width,(ulong)params->dst_height,
                 (ulong)params->dst_width_vir,(ulong)uVar3);
    }
    iVar4 = iVar4 + 1;
  }
  if (((params->src_width_vir & 0xf) != 0) || ((params->dst_width_vir & 0xf) != 0)) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep only support img_w_i/o_vir 16Byte align\n",(char *)0x0);
    }
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_w_vir %d dst img_w_vir %d\n",(char *)0x0,
                 (ulong)params->src_width_vir,(ulong)params->dst_width_vir);
    }
    iVar4 = iVar4 + 1;
  }
  if ((params->src_height_vir & 7) != 0) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep only support img_h_in_vir 8pix align\n",(char *)0x0);
    }
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported src img_h_vir %d\n",(char *)0x0,
                 (ulong)params->src_height_vir);
    }
    iVar4 = iVar4 + 1;
  }
  if ((params->dst_height_vir & 1) != 0) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep only support img_h_out_vir 2pix align\n",(char *)0x0);
    }
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",(char *)0x0,
                 (ulong)params->dst_height_vir);
    }
    iVar4 = iVar4 + 1;
  }
  if (((((params->src_width & 1) != 0) || ((params->src_height & 1) != 0)) ||
      ((params->dst_width & 1) != 0)) || ((params->dst_height & 1) != 0)) {
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep only support img_w/h_vld 2pix align\n",(char *)0x0);
    }
    if (((byte)vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",
                 (char *)0x0,(ulong)params->src_width,(ulong)params->src_height,
                 (ulong)params->dst_width,(ulong)params->dst_height);
    }
    iVar4 = iVar4 + 1;
  }
  if (params->yuv_out_diff != 0) {
    uVar3 = params->dst_c_height_vir;
    if ((((0x800 < uVar3) || (uVar1 = params->dst_c_width_vir, 0x780 < uVar1)) ||
        ((params->dst_c_height < 0x80 ||
         ((uVar1 < params->dst_c_width || (uVar3 < params->dst_c_height)))))) ||
       ((uVar1 < 0x80 || ((uVar3 < 0x80 || (params->dst_c_width < 0x80)))))) {
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst_c img_w %d img_h %d img_w_vir %d img_h_vir %d\n",
                   (char *)0x0,(ulong)params->dst_c_width,(ulong)params->dst_c_height,
                   (ulong)params->dst_c_width_vir,(ulong)uVar3);
      }
      iVar4 = iVar4 + 1;
    }
    if ((params->dst_c_width_vir & 0xf) != 0) {
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_w_c_out_vir 16Byte align\n",(char *)0x0);
      }
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_w_c_vir %d\n",(char *)0x0,
                   (ulong)params->dst_c_width_vir);
      }
      iVar4 = iVar4 + 1;
    }
    if ((params->dst_c_height_vir & 1) != 0) {
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_h_c_out_vir 2pix align\n",(char *)0x0);
      }
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",(char *)0x0,
                   (ulong)params->dst_c_height_vir);
      }
      iVar4 = iVar4 + 1;
    }
    if (((params->dst_c_width & 1) != 0) || ((params->dst_c_height & 1) != 0)) {
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_c_w/h_vld 2pix align\n",(char *)0x0);
      }
      if (((byte)vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported img_w_o %d img_h_o %d\n",(char *)0x0,
                   (ulong)params->dst_c_width,(ulong)params->dst_c_height);
      }
      iVar4 = iVar4 + 1;
    }
  }
  if (((((0x1000 < params->src_height_vir) || (0x1000 < params->src_width_vir)) ||
       (params->src_height < 0x80)) || (bVar2 = false, params->src_width < 0x80)) &&
     (bVar2 = true, ((byte)vdpp2_debug & 4) != 0)) {
    _mpp_log_l(4,"vdpp2","dci unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",
               (char *)0x0,(ulong)params->src_width,(ulong)params->src_height,
               (ulong)params->src_width_vir,(ulong)params->src_height_vir);
  }
  if ((params->src_fmt < 0x12) && ((0x2000aU >> (params->src_fmt & 0x1f) & 1) != 0)) {
    if (((params->src_width_vir & 0xf) == 0) || (bVar2 = true, ((byte)vdpp2_debug & 4) == 0))
    goto LAB_0013d8a6;
    fmt = "dci Y-10bit input only support img_w_in_vir 16Byte align\n";
  }
  else {
    if (((params->src_width_vir & 3) == 0) || (bVar2 = true, ((byte)vdpp2_debug & 4) == 0))
    goto LAB_0013d8a6;
    fmt = "dci only support img_w_in_vir 4Byte align\n";
  }
  _mpp_log_l(4,"vdpp2",fmt,(char *)0x0);
  bVar2 = true;
LAB_0013d8a6:
  if (((byte)vdpp2_debug & 2) != 0) {
    _mpp_log_l(4,"vdpp2","vdpp2 src img resolution: w-%d-%d, h-%d-%d\n",(char *)0x0,
               (ulong)params->src_width,(ulong)params->src_width_vir,(ulong)params->src_height,
               (ulong)params->src_height_vir);
  }
  if (((byte)vdpp2_debug & 2) != 0) {
    _mpp_log_l(4,"vdpp2","vdpp2 dst img resolution: w-%d-%d, h-%d-%d\n",(char *)0x0,
               (ulong)params->dst_width,(ulong)params->dst_width_vir,(ulong)params->dst_height,
               (ulong)params->dst_height_vir);
  }
  uVar3 = 0;
  if ((iVar4 == 0) && (uVar3 = 1, ((byte)vdpp2_debug & 2) != 0)) {
    _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_VEP\n",(char *)0x0);
  }
  if (!bVar2) {
    if (((byte)vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_HIST\n",(char *)0x0);
    }
    return uVar3 | 2;
  }
  return uVar3;
}

Assistant:

static RK_S32 check_cap(struct vdpp_params *params)
{
    RK_S32 ret_cap = VDPP_CAP_UNSUPPORTED;
    RK_U32 vep_mode_check = 0;

    if (NULL == params) {
        VDPP_DBG(VDPP_DBG_CHECK, "found null pointer params\n");
        return VDPP_CAP_UNSUPPORTED;
    }

    if ((params->src_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->src_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep src unsupported img_w %d img_h %d\n",
                 params->src_height, params->src_width);
        vep_mode_check++;
    }

    if ((params->dst_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->dst_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep dst unsupported img_w %d img_h %d\n",
                 params->dst_height, params->dst_width);
        vep_mode_check++;
    }

    if ((params->src_width & 1) || (params->src_height & 1) ||
        (params->dst_width & 1) || (params->dst_height & 1)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep only support img_w/h_vld 2pix align\n");
        VDPP_DBG(VDPP_DBG_CHECK, "vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",
                 params->src_width, params->src_height, params->dst_width, params->dst_height);
        vep_mode_check++;
    }

    if (!vep_mode_check) {
        ret_cap |= VDPP_CAP_VEP;
        VDPP_DBG(VDPP_DBG_INT, "vdpp support mode: VDPP_CAP_VEP\n");
    }

    return ret_cap;
}